

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::maketetrahedron(tetgenmesh *this,triface *newtet)

{
  tetrahedron *pppdVar1;
  int local_1c;
  int i;
  triface *newtet_local;
  tetgenmesh *this_local;
  
  pppdVar1 = (tetrahedron *)memorypool::alloc(this->tetrahedrons);
  newtet->tet = pppdVar1;
  *newtet->tet = (tetrahedron)0x0;
  newtet->tet[1] = (tetrahedron)0x0;
  newtet->tet[2] = (tetrahedron)0x0;
  newtet->tet[3] = (tetrahedron)0x0;
  newtet->tet[4] = (tetrahedron)0x0;
  newtet->tet[5] = (tetrahedron)0x0;
  newtet->tet[6] = (tetrahedron)0x0;
  newtet->tet[7] = (tetrahedron)0x0;
  newtet->tet[8] = (tetrahedron)0x0;
  newtet->tet[9] = (tetrahedron)0x0;
  setelemmarker(this,newtet->tet,0);
  for (local_1c = 0; local_1c < this->numelemattrib; local_1c = local_1c + 1) {
    setelemattribute(this,newtet->tet,local_1c,0.0);
  }
  if (this->b->varvolume != 0) {
    setvolumebound(this,newtet->tet,-1.0);
  }
  newtet->ver = 0xb;
  return;
}

Assistant:

void tetgenmesh::maketetrahedron(triface *newtet)
{
  newtet->tet = (tetrahedron *) tetrahedrons->alloc();

  // Initialize the four adjoining tetrahedra to be "outer space".
  newtet->tet[0] = NULL;
  newtet->tet[1] = NULL;
  newtet->tet[2] = NULL;
  newtet->tet[3] = NULL;
  // Four NULL vertices.
  newtet->tet[4] = NULL;
  newtet->tet[5] = NULL;
  newtet->tet[6] = NULL;
  newtet->tet[7] = NULL;
  // No attached segments and subfaces yet.
  newtet->tet[8] = NULL; 
  newtet->tet[9] = NULL; 
  // Initialize the marker (clear all flags).
  setelemmarker(newtet->tet, 0);
  for (int i = 0; i < numelemattrib; i++) {
    setelemattribute(newtet->tet, i, 0.0);
  }
  if (b->varvolume) {
    setvolumebound(newtet->tet, -1.0);
  }

  // Initialize the version to be Zero.
  newtet->ver = 11;
}